

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircularBuffer.cpp
# Opt level: O0

void __thiscall CircularBuffer::Print(CircularBuffer *this,Printer *p)

{
  int local_24;
  int local_20;
  int i;
  int count;
  int printIndex;
  Printer *p_local;
  CircularBuffer *this_local;
  
  (*p->_vptr_Printer[2])(p,"Circular buffer content:\n<");
  i = this->outdex;
  local_20 = this->index - this->outdex;
  if (((this->empty & 1U) == 0) && (this->index <= this->outdex)) {
    local_20 = this->capacity - (this->outdex - this->index);
  }
  for (local_24 = 0; local_24 < local_20; local_24 = local_24 + 1) {
    (*p->_vptr_Printer[3])(p,(long)this->buffer[i]);
    i = Next(this,i);
    if (local_24 + 1 != local_20) {
      (*p->_vptr_Printer[2])(p,", ");
    }
  }
  (*p->_vptr_Printer[2])(p,">\n");
  return;
}

Assistant:

void CircularBuffer::Print(Printer* p)
{
    p->Print("Circular buffer content:\n<");

    int printIndex = outdex;
    int count = index - outdex;

    if (!empty && (index <= outdex))
        count = capacity - (outdex - index);

    for (int i = 0; i < count; i++) {
        p->Print(buffer[printIndex]);
        printIndex = Next(printIndex);
        if (i + 1 != count)
            p->Print(", ");
    }
    p->Print(">\n");
}